

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O3

void graph_vis(t_gobj *gr,_glist *parent_glist,int vis)

{
  float fVar1;
  undefined1 auVar2 [16];
  _gobj *p_Var3;
  int iVar4;
  undefined4 extraout_EAX;
  uint uVar5;
  int iVar6;
  int iVar7;
  _rtext *p_Var8;
  _gobj *p_Var9;
  char *anchor;
  char *anchor_00;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  t_pd p_Var13;
  int iVar14;
  bool bVar15;
  long lVar16;
  t_float tVar17;
  t_float tVar18;
  float fVar19;
  t_float tVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  char **ppcVar25;
  int x1;
  ulong local_d0;
  char *tags2 [2];
  int y2;
  int x2;
  int y1;
  char *tags3 [3];
  t_symbol *arrayname;
  char tag [50];
  
  tags2[0] = tag;
  tags2[1] = "graph";
  if (((ulong)gr[0xe].g_next & 0x100) == 0) {
    text_vis(gr,parent_glist,vis);
  }
  else if (vis == 0) {
    graph_getrect(gr,parent_glist,&x1,&y1,&x2,&y2);
    p_Var8 = glist_findrtext(parent_glist,(t_text *)gr);
    rtext_erase(p_Var8);
    sprintf(tag,"graph%lx",gr);
    glist_eraseiofor(parent_glist,(t_object *)gr,tag);
    p_Var3 = gr[4].g_next;
    if (((ulong)gr[0xe].g_next & 1) == 0) {
      do {
        p_Var9 = p_Var3;
        if (p_Var9[4].g_next == (_gobj *)0x0) break;
        p_Var3 = p_Var9[4].g_next;
      } while (((ulong)p_Var9[0xe].g_next & 0x901) == 0x100);
      pdgui_vmess((char *)0x0,"crs",p_Var9,"delete",tag);
      for (p_Var13 = gr[3].g_pd; p_Var13 != (t_pd)0x0; p_Var13 = (t_pd)p_Var13->c_helpname) {
        gobj_vis((t_gobj *)p_Var13,(_glist *)gr,0);
      }
    }
    else {
      do {
        p_Var9 = p_Var3;
        if (p_Var9[4].g_next == (_gobj *)0x0) break;
        p_Var3 = p_Var9[4].g_next;
      } while (((ulong)p_Var9[0xe].g_next & 0x901) == 0x100);
      pdgui_vmess((char *)0x0,"crs",p_Var9,"delete",tag);
    }
  }
  else {
    iVar4 = canvas_showtext((_glist *)gr);
    if (iVar4 != 0) {
      p_Var8 = glist_findrtext(parent_glist,(t_text *)gr);
      rtext_draw(p_Var8);
    }
    graph_getrect(gr,parent_glist,&x1,&y1,&x2,&y2);
    sprintf(tag,"graph%lx",gr);
    uVar10 = (ulong)(uint)x1;
    uVar11 = (ulong)(uint)y1;
    local_d0 = (ulong)(uint)x2;
    uVar12 = (ulong)(uint)y2;
    glist_drawiofor(parent_glist,(t_object *)gr,1,tag,x1,y1,x2,y2);
    if (((ulong)gr[0xe].g_next & 1) == 0) {
      lVar16 = -(ulong)(((float)((ulong)gr[6].g_pd >> 0x20) + (float)((ulong)gr[5].g_next >> 0x20))
                        * 0.5 < *(float *)&gr[9].g_next);
      auVar2._8_4_ = (int)lVar16;
      auVar2._0_8_ = -(ulong)((SUB84(gr[6].g_pd,0) + SUB84(gr[5].g_next,0)) * 0.5 <
                             *(float *)&gr[0xb].g_next);
      auVar2._12_4_ = (int)((ulong)lVar16 >> 0x20);
      uVar5 = movmskpd(extraout_EAX,auVar2);
      anchor = "e";
      if ((uVar5 & 1) != 0) {
        anchor = "w";
      }
      anchor_00 = "n";
      if ((uVar5 & 2) != 0) {
        anchor_00 = "s";
      }
      iVar4 = glist_getfont((_glist *)gr);
      iVar6 = glist_getzoom((_glist *)gr);
      iVar4 = sys_hostfontsize(iVar4,iVar6);
      tags3[1] = "label";
      tags3[2] = "graph";
      p_Var3 = gr[4].g_next;
      do {
        p_Var9 = p_Var3;
        if (p_Var9[4].g_next == (_gobj *)0x0) break;
        p_Var3 = p_Var9[4].g_next;
      } while (((ulong)p_Var9[0xe].g_next & 0x901) == 0x100);
      tags3[0] = tag;
      uVar5 = glist_getzoom((_glist *)gr);
      pdgui_vmess((char *)0x0,"crr iiiiiiiiii ri rr rS",p_Var9,"create","line",uVar10,uVar11,uVar10,
                  uVar12,local_d0,uVar12,local_d0,uVar11,uVar10,uVar11,"-width",(ulong)uVar5,
                  "-capstyle","projecting","-tags",2,tags2);
      p_Var13 = gr[3].g_pd;
      if (p_Var13 != (t_pd)0x0) {
        iVar6 = y2;
        if (y1 < y2) {
          iVar6 = y1;
        }
        iVar6 = iVar6 + -1;
        do {
          if (((_class *)p_Var13->c_name == garray_class) &&
             (iVar7 = garray_getname((_garray *)p_Var13,&arrayname), iVar7 == 0)) {
            ppcVar25 = (char **)0x148e3e;
            iVar7 = glist_fontheight((_glist *)gr);
            iVar6 = iVar6 - iVar7;
            _graph_create_text((_glist *)gr,x1,iVar6,arrayname->s_name,"nw",-iVar4,(int)tags3,
                               ppcVar25);
          }
          p_Var13 = (t_pd)p_Var13->c_helpname;
        } while (p_Var13 != (t_pd)0x0);
      }
      if (*(int *)&gr[8].g_next != 0) {
        iVar6 = y1;
        if (y1 < y2) {
          iVar6 = y2;
        }
        if (y2 < y1) {
          y1 = y2;
        }
        fVar19 = *(float *)&gr[8].g_pd;
        fVar1 = *(float *)&gr[6].g_pd;
        fVar21 = *(float *)&gr[5].g_next;
        iVar6 = (int)(float)iVar6;
        iVar7 = (int)(float)y1;
        if (fVar1 * 0.99 + fVar21 * 0.01 <= fVar19) {
          fVar23 = *(float *)((long)&gr[8].g_pd + 4);
        }
        else {
          iVar14 = 0;
          do {
            bVar15 = iVar14 % *(int *)&gr[8].g_next == 0;
            tVar17 = glist_xtopixels((_glist *)gr,fVar19);
            tVar18 = glist_xtopixels((_glist *)gr,fVar19);
            _graph_create_line4((_glist *)gr,(int)tVar17,iVar6,(int)tVar18,
                                iVar6 - ((uint)bVar15 * 2 + 2),tags2);
            tVar17 = glist_xtopixels((_glist *)gr,fVar19);
            tVar18 = glist_xtopixels((_glist *)gr,fVar19);
            _graph_create_line4((_glist *)gr,(int)tVar17,iVar7,(int)tVar18,
                                iVar7 + (uint)bVar15 * 2 + 2,tags2);
            iVar14 = iVar14 + 1;
            fVar23 = *(float *)((long)&gr[8].g_pd + 4);
            fVar19 = fVar19 + fVar23;
            fVar1 = *(float *)&gr[6].g_pd;
            fVar21 = *(float *)&gr[5].g_next;
          } while (fVar19 < fVar1 * 0.99 + fVar21 * 0.01);
          fVar19 = *(float *)&gr[8].g_pd;
        }
        tVar17 = fVar19 - fVar23;
        if (fVar21 * 0.99 + fVar1 * 0.01 < tVar17) {
          iVar14 = 1;
          do {
            bVar15 = iVar14 % *(int *)&gr[8].g_next == 0;
            tVar18 = glist_xtopixels((_glist *)gr,tVar17);
            tVar20 = glist_xtopixels((_glist *)gr,tVar17);
            _graph_create_line4((_glist *)gr,(int)tVar18,iVar6,(int)tVar20,
                                iVar6 - ((uint)bVar15 * 2 + 2),tags2);
            tVar18 = glist_xtopixels((_glist *)gr,tVar17);
            tVar20 = glist_xtopixels((_glist *)gr,tVar17);
            _graph_create_line4((_glist *)gr,(int)tVar18,iVar7,(int)tVar20,
                                iVar7 + (uint)bVar15 * 2 + 2,tags2);
            iVar14 = iVar14 + 1;
            tVar17 = tVar17 - *(float *)((long)&gr[8].g_pd + 4);
          } while (*(float *)&gr[5].g_next * 0.99 + *(float *)&gr[6].g_pd * 0.01 < tVar17);
        }
      }
      if (*(int *)((long)&gr[10].g_pd + 4) != 0) {
        fVar1 = *(float *)((long)&gr[5].g_next + 4);
        fVar21 = *(float *)((long)&gr[6].g_pd + 4);
        fVar19 = fVar21;
        if (fVar1 <= fVar21) {
          fVar19 = fVar1;
          fVar1 = fVar21;
        }
        fVar21 = *(float *)((long)&gr[9].g_next + 4);
        fVar23 = fVar1 * 0.99 + fVar19 * 0.01;
        if (fVar23 <= fVar21) {
          fVar24 = *(float *)&gr[10].g_pd;
        }
        else {
          iVar6 = 0;
          do {
            bVar15 = iVar6 % *(int *)((long)&gr[10].g_pd + 4) == 0;
            tVar17 = glist_ytopixels((_glist *)gr,fVar21);
            tVar18 = glist_ytopixels((_glist *)gr,fVar21);
            _graph_create_line4((_glist *)gr,x1,(int)tVar17,x1 + (uint)bVar15 * 2 + 2,(int)tVar18,
                                tags2);
            tVar17 = glist_ytopixels((_glist *)gr,fVar21);
            iVar7 = (int)local_d0;
            tVar18 = glist_ytopixels((_glist *)gr,fVar21);
            _graph_create_line4((_glist *)gr,iVar7,(int)tVar17,iVar7 - ((uint)bVar15 * 2 + 2),
                                (int)tVar18,tags2);
            iVar6 = iVar6 + 1;
            fVar24 = *(float *)&gr[10].g_pd;
            fVar21 = fVar21 + fVar24;
          } while (fVar21 < fVar23);
          fVar21 = *(float *)((long)&gr[9].g_next + 4);
        }
        uVar10 = local_d0;
        tVar17 = fVar21 - fVar24;
        fVar1 = fVar19 * 0.99 + fVar1 * 0.01;
        if (fVar1 < tVar17) {
          iVar6 = 1;
          do {
            bVar15 = iVar6 % *(int *)((long)&gr[10].g_pd + 4) == 0;
            tVar18 = glist_ytopixels((_glist *)gr,tVar17);
            tVar20 = glist_ytopixels((_glist *)gr,tVar17);
            _graph_create_line4((_glist *)gr,x1,(int)tVar18,x1 + (uint)bVar15 * 2 + 2,(int)tVar20,
                                tags2);
            tVar18 = glist_ytopixels((_glist *)gr,tVar17);
            tVar20 = glist_ytopixels((_glist *)gr,tVar17);
            _graph_create_line4((_glist *)gr,(int)uVar10,(int)tVar18,
                                (int)uVar10 - ((uint)bVar15 * 2 + 2),(int)tVar20,tags2);
            tVar17 = tVar17 - *(float *)&gr[10].g_pd;
            iVar6 = iVar6 + 1;
          } while (fVar1 < tVar17);
        }
      }
      if (0 < *(int *)((long)&gr[8].g_next + 4)) {
        lVar16 = 0;
        do {
          dVar22 = atof((&(gr[9].g_pd)->c_name)[lVar16]->s_name);
          tVar17 = glist_xtopixels((_glist *)gr,(float)dVar22);
          ppcVar25 = (char **)0x1495aa;
          tVar18 = glist_ytopixels((_glist *)gr,*(t_float *)&gr[9].g_next);
          _graph_create_text((_glist *)gr,(int)tVar17,(int)tVar18,
                             (&(gr[9].g_pd)->c_name)[lVar16]->s_name,anchor_00,-iVar4,(int)tags3,
                             ppcVar25);
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)((long)&gr[8].g_next + 4));
      }
      if (0 < *(int *)&gr[10].g_next) {
        lVar16 = 0;
        do {
          tVar17 = glist_xtopixels((_glist *)gr,*(t_float *)&gr[0xb].g_next);
          dVar22 = atof((&(gr[0xb].g_pd)->c_name)[lVar16]->s_name);
          ppcVar25 = (char **)0x149639;
          tVar18 = glist_ytopixels((_glist *)gr,(float)dVar22);
          _graph_create_text((_glist *)gr,(int)tVar17,(int)tVar18,
                             (&(gr[0xb].g_pd)->c_name)[lVar16]->s_name,anchor,-iVar4,(int)tags3,
                             ppcVar25);
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)&gr[10].g_next);
      }
      for (p_Var13 = gr[3].g_pd; p_Var13 != (t_pd)0x0; p_Var13 = (t_pd)p_Var13->c_helpname) {
        gobj_vis((t_gobj *)p_Var13,(_glist *)gr,1);
      }
    }
    else {
      p_Var3 = gr[4].g_next;
      do {
        p_Var9 = p_Var3;
        if (p_Var9[4].g_next == (_gobj *)0x0) break;
        p_Var3 = p_Var9[4].g_next;
      } while (((ulong)p_Var9[0xe].g_next & 0x901) == 0x100);
      uVar5 = glist_getzoom((_glist *)gr);
      pdgui_vmess((char *)0x0,"crr iiiiiiiiii ri rr rr rS",p_Var9,"create","polygon",uVar10,uVar11,
                  uVar10,uVar12,local_d0,uVar12,local_d0,uVar11,uVar10,uVar11,"-width",(ulong)uVar5,
                  "-fill","#c0c0c0","-joinstyle","miter","-tags",2,tags2);
    }
  }
  return;
}

Assistant:

static void graph_vis(t_gobj *gr, t_glist *parent_glist, int vis)
{
    t_glist *x = (t_glist *)gr;
    char tag[50];
    const char *tags2[] = {tag, "graph" };
    t_gobj *g;
    int x1, y1, x2, y2;
        /* ordinary subpatches: just act like a text object */
    if (!x->gl_isgraph)
    {
        text_widgetbehavior.w_visfn(gr, parent_glist, vis);
        return;
    }

    if (vis && canvas_showtext(x))
        rtext_draw(glist_findrtext(parent_glist, &x->gl_obj));
    graph_getrect(gr, parent_glist, &x1, &y1, &x2, &y2);
    if (!vis)
        rtext_erase(glist_findrtext(parent_glist, &x->gl_obj));

    sprintf(tag, "graph%lx", (t_int)x);
    if (vis)
        glist_drawiofor(parent_glist, &x->gl_obj, 1,
            tag, x1, y1, x2, y2);
    else glist_eraseiofor(parent_glist, &x->gl_obj, tag);
        /* if we look like a graph but have been moved to a toplevel,
        just show the bounding rectangle */
    if (x->gl_havewindow)
    {
        if (vis)
            pdgui_vmess(0, "crr iiiiiiiiii ri rr rr rS",
                glist_getcanvas(x->gl_owner), "create", "polygon",
                x1,y1, x1,y2, x2,y2, x2,y1, x1,y1,
                "-width", glist_getzoom(x),
                "-fill", "#c0c0c0",
                "-joinstyle", "miter",
                "-tags", 2, tags2);
        else
            pdgui_vmess(0, "crs",
                glist_getcanvas(x->gl_owner), "delete", tag);
        return;
    }
        /* otherwise draw (or erase) us as a graph inside another glist. */
    if (vis)
    {
        int i;
        t_float f;
        t_gobj *g;
        t_symbol *arrayname;
        char *ylabelanchor =
            (x->gl_ylabelx > 0.5*(x->gl_x1 + x->gl_x2) ? "w" : "e");
        char *xlabelanchor =
            (x->gl_xlabely > 0.5*(x->gl_y1 + x->gl_y2) ? "s" : "n");
        int fs = sys_hostfontsize(glist_getfont(x), glist_getzoom(x));
        const char *tags3[] = {tag, "label", "graph" };

            /* draw a rectangle around the graph */
        pdgui_vmess(0, "crr iiiiiiiiii ri rr rS",
                  glist_getcanvas(x->gl_owner),
                  "create", "line",
                  x1,y1, x1,y2, x2,y2, x2,y1, x1,y1,
                  "-width", glist_getzoom(x),
                  "-capstyle", "projecting",
                  "-tags", 2, tags2);
            /* if there's just one "garray" in the graph, write its name
                along the top */
        for (i = (y1 < y2 ? y1 : y2)-1, g = x->gl_list; g; g = g->g_next)
            if (g->g_pd == garray_class &&
                !garray_getname((t_garray *)g, &arrayname))
        {
            i -= glist_fontheight(x);
            _graph_create_text(x,
                x1, i,
                arrayname->s_name,
                "nw", -fs,
                3, tags3);
        }

            /* draw ticks on horizontal borders.  If lperb field is
            zero, this is disabled. */
        if (x->gl_xtick.k_lperb)
        {
            t_float upix, lpix;
            if (y2 < y1)
                upix = y1, lpix = y2;
            else upix = y2, lpix = y1;
            for (i = 0, f = x->gl_xtick.k_point;
                f < 0.99 * x->gl_x2 + 0.01*x->gl_x1; i++,
                    f += x->gl_xtick.k_inc)
            {
                int tickpix = (i % x->gl_xtick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)upix,
                    (int)glist_xtopixels(x, f), (int)upix - tickpix,
                    tags2);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)lpix,
                    (int)glist_xtopixels(x, f), (int)lpix + tickpix,
                    tags2);
            }
            for (i = 1, f = x->gl_xtick.k_point - x->gl_xtick.k_inc;
                f > 0.99 * x->gl_x1 + 0.01*x->gl_x2;
                    i++, f -= x->gl_xtick.k_inc)
            {
                int tickpix = (i % x->gl_xtick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)upix,
                    (int)glist_xtopixels(x, f), (int)upix - tickpix,
                    tags2);
                _graph_create_line4(x,
                    (int)glist_xtopixels(x, f), (int)lpix,
                    (int)glist_xtopixels(x, f), (int)lpix + tickpix,
                    tags2);
            }
        }

            /* draw ticks in vertical borders*/
        if (x->gl_ytick.k_lperb)
        {
            t_float ubound, lbound;
            if (x->gl_y2 < x->gl_y1)
                ubound = x->gl_y1, lbound = x->gl_y2;
            else ubound = x->gl_y2, lbound = x->gl_y1;
            for (i = 0, f = x->gl_ytick.k_point;
                f < 0.99 * ubound + 0.01 * lbound;
                    i++, f += x->gl_ytick.k_inc)
            {
                int tickpix = (i % x->gl_ytick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    x1, (int)glist_ytopixels(x, f),
                    x1 + tickpix, (int)glist_ytopixels(x, f),
                    tags2);
                _graph_create_line4(x,
                    x2, (int)glist_ytopixels(x, f),
                    x2 - tickpix, (int)glist_ytopixels(x, f),
                    tags2);
            }
            for (i = 1, f = x->gl_ytick.k_point - x->gl_ytick.k_inc;
                f > 0.99 * lbound + 0.01 * ubound;
                    i++, f -= x->gl_ytick.k_inc)
            {
                int tickpix = (i % x->gl_ytick.k_lperb ? 2 : 4);
                _graph_create_line4(x,
                    x1, (int)glist_ytopixels(x, f),
                    x1 + tickpix, (int)glist_ytopixels(x, f),
                    tags2);
                _graph_create_line4(x,
                    x2, (int)glist_ytopixels(x, f),
                    x2 - tickpix, (int)glist_ytopixels(x, f),
                    tags2);
            }
        }
            /* draw x labels */
        for (i = 0; i < x->gl_nxlabels; i++)
            _graph_create_text(x,
                (int)glist_xtopixels(x, atof(x->gl_xlabel[i]->s_name)),
                (int)glist_ytopixels(x, x->gl_xlabely),
                x->gl_xlabel[i]->s_name,
                xlabelanchor, -fs,
                3, tags3);
            /* draw y labels */
        for (i = 0; i < x->gl_nylabels; i++)
            _graph_create_text(x,
                (int)glist_xtopixels(x, x->gl_ylabelx),
                (int)glist_ytopixels(x, atof(x->gl_ylabel[i]->s_name)),
                x->gl_ylabel[i]->s_name,
                ylabelanchor, -fs,
                3, tags3);

            /* draw contents of graph as glist */
        for (g = x->gl_list; g; g = g->g_next)
            gobj_vis(g, x, 1);
    }
    else
    {
        pdgui_vmess(0, "crs", glist_getcanvas(x->gl_owner), "delete", tag);
        for (g = x->gl_list; g; g = g->g_next)
            gobj_vis(g, x, 0);
    }
}